

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLECompressState<int,_true>::RLECompressState
          (RLECompressState<int,_true> *this,ColumnDataCheckpointData *checkpoint_data_p,
          CompressionInfo *info)

{
  CompressionFunction *pCVar1;
  BlockManager *pBVar2;
  CompressionInfo *in_RDX;
  _func_int **in_RSI;
  CompressionState *in_RDI;
  idx_t in_stack_00000038;
  RLECompressState<int,_true> *in_stack_00000040;
  RLECompressState<int,_true> *in_stack_ffffffffffffffa0;
  BufferHandle *this_00;
  CompressionInfo *pCVar3;
  ColumnDataCheckpointData *in_stack_ffffffffffffffd0;
  
  CompressionState::CompressionState(in_RDI,in_RDX);
  in_RDI->_vptr_CompressionState = (_func_int **)&PTR__RLECompressState_0350f668;
  in_RDI[1]._vptr_CompressionState = in_RSI;
  pCVar3 = &in_RDI[1].info;
  pCVar1 = ColumnDataCheckpointData::GetCompressionFunction
                     (in_stack_ffffffffffffffd0,(CompressionType)((ulong)pCVar3 >> 0x38));
  pCVar3->block_manager = (BlockManager *)pCVar1;
  this_00 = (BufferHandle *)(in_RDI + 2);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa4c044);
  BufferHandle::BufferHandle(this_00);
  RLEState<int>::RLEState((RLEState<int> *)in_stack_ffffffffffffffa0);
  in_RDI[6]._vptr_CompressionState = (_func_int **)0x0;
  ColumnDataCheckpointData::GetRowGroup((ColumnDataCheckpointData *)0xa4c07f);
  CreateEmptySegment(in_stack_00000040,in_stack_00000038);
  in_RDI[5]._vptr_CompressionState = (_func_int **)in_RDI;
  pBVar2 = (BlockManager *)MaxRLECount(in_stack_ffffffffffffffa0);
  in_RDI[6].info.block_manager = pBVar2;
  return;
}

Assistant:

RLECompressState(ColumnDataCheckpointData &checkpoint_data_p, const CompressionInfo &info)
	    : CompressionState(info), checkpoint_data(checkpoint_data_p),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_RLE)) {
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);

		state.dataptr = (void *)this;
		max_rle_count = MaxRLECount();
	}